

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int readJournalHdr(Pager *pPager,int isHot,i64 journalSize,u32 *pNRec,u32 *pDbSize)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  uchar ac [4];
  u32 iPageSize;
  uchar aMagic [8];
  uint local_30;
  uint local_2c;
  long local_28;
  
  if (pPager->journalOff == 0) {
    lVar4 = 0;
  }
  else {
    lVar4 = ((pPager->journalOff + -1) / (long)(ulong)pPager->sectorSize + 1) *
            (ulong)pPager->sectorSize;
  }
  pPager->journalOff = lVar4;
  if (journalSize < (long)((ulong)pPager->sectorSize + lVar4)) {
    return 0x65;
  }
  if ((isHot != 0) || (lVar4 != pPager->journalHdr)) {
    iVar2 = (*pPager->jfd->pMethods->xRead)(pPager->jfd,&local_28,8,lVar4);
    if (iVar2 != 0) {
      return iVar2;
    }
    if (local_28 != -0x289c5edf06fa2a27) {
      return 0x65;
    }
  }
  iVar2 = (*pPager->jfd->pMethods->xRead)(pPager->jfd,&local_30,4,lVar4 + 8);
  if (iVar2 != 0) {
    return iVar2;
  }
  *pNRec = local_30 >> 0x18 | (local_30 & 0xff0000) >> 8 | (local_30 & 0xff00) << 8 |
           local_30 << 0x18;
  iVar2 = (*pPager->jfd->pMethods->xRead)(pPager->jfd,&local_30,4,lVar4 + 0xc);
  if (iVar2 != 0) {
    return iVar2;
  }
  pPager->cksumInit =
       local_30 >> 0x18 | (local_30 & 0xff0000) >> 8 | (local_30 & 0xff00) << 8 | local_30 << 0x18;
  iVar2 = (*pPager->jfd->pMethods->xRead)(pPager->jfd,&local_30,4,lVar4 + 0x10);
  if (iVar2 != 0) {
    return iVar2;
  }
  *pDbSize = local_30 >> 0x18 | (local_30 & 0xff0000) >> 8 | (local_30 & 0xff00) << 8 |
             local_30 << 0x18;
  iVar2 = 0;
  if (pPager->journalOff != 0) goto LAB_00125852;
  iVar3 = (*pPager->jfd->pMethods->xRead)(pPager->jfd,&local_30,4,lVar4 + 0x14);
  uVar5 = local_30;
  iVar2 = iVar3;
  if ((iVar3 == 0) &&
     (iVar3 = (*pPager->jfd->pMethods->xRead)(pPager->jfd,&local_30,4,lVar4 + 0x18), iVar2 = iVar3,
     iVar3 == 0)) {
    local_2c = local_30 >> 0x18 | (local_30 & 0xff0000) >> 8 | (local_30 & 0xff00) << 8 |
               local_30 << 0x18;
    if (local_30 == 0) {
      local_2c = pPager->pageSize;
    }
    iVar3 = 0x65;
    iVar2 = 0;
    if (((local_2c - 0x10001 < 0xffff01ff) ||
        (uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18,
        uVar5 - 0x10001 < 0xffff001f)) || (iVar2 = 0, (local_2c + 0x1ffff & local_2c) != 0))
    goto LAB_0012584c;
    bVar1 = false;
    iVar2 = 0;
    if ((uVar5 + 0x1ffff & uVar5) == 0) {
      iVar3 = sqlite3PagerSetPagesize(pPager,&local_2c,-1);
      pPager->sectorSize = uVar5;
      bVar1 = true;
      iVar2 = iVar3;
    }
  }
  else {
LAB_0012584c:
    bVar1 = false;
  }
  if (!bVar1) {
    return iVar3;
  }
LAB_00125852:
  pPager->journalOff = pPager->journalOff + (ulong)pPager->sectorSize;
  return iVar2;
}

Assistant:

static int readJournalHdr(
  Pager *pPager,               /* Pager object */
  int isHot,
  i64 journalSize,             /* Size of the open journal file in bytes */
  u32 *pNRec,                  /* OUT: Value read from the nRec field */
  u32 *pDbSize                 /* OUT: Value of original database size field */
){
  int rc;                      /* Return code */
  unsigned char aMagic[8];     /* A buffer to hold the magic header */
  i64 iHdrOff;                 /* Offset of journal header being read */

  assert( isOpen(pPager->jfd) );      /* Journal file must be open. */

  /* Advance Pager.journalOff to the start of the next sector. If the
  ** journal file is too small for there to be a header stored at this
  ** point, return SQLITE_DONE.
  */
  pPager->journalOff = journalHdrOffset(pPager);
  if( pPager->journalOff+JOURNAL_HDR_SZ(pPager) > journalSize ){
    return SQLITE_DONE;
  }
  iHdrOff = pPager->journalOff;

  /* Read in the first 8 bytes of the journal header. If they do not match
  ** the  magic string found at the start of each journal header, return
  ** SQLITE_DONE. If an IO error occurs, return an error code. Otherwise,
  ** proceed.
  */
  if( isHot || iHdrOff!=pPager->journalHdr ){
    rc = sqlite3OsRead(pPager->jfd, aMagic, sizeof(aMagic), iHdrOff);
    if( rc ){
      return rc;
    }
    if( memcmp(aMagic, aJournalMagic, sizeof(aMagic))!=0 ){
      return SQLITE_DONE;
    }
  }

  /* Read the first three 32-bit fields of the journal header: The nRec
  ** field, the checksum-initializer and the database size at the start
  ** of the transaction. Return an error code if anything goes wrong.
  */
  if( SQLITE_OK!=(rc = read32bits(pPager->jfd, iHdrOff+8, pNRec))
   || SQLITE_OK!=(rc = read32bits(pPager->jfd, iHdrOff+12, &pPager->cksumInit))
   || SQLITE_OK!=(rc = read32bits(pPager->jfd, iHdrOff+16, pDbSize))
  ){
    return rc;
  }

  if( pPager->journalOff==0 ){
    u32 iPageSize;               /* Page-size field of journal header */
    u32 iSectorSize;             /* Sector-size field of journal header */

    /* Read the page-size and sector-size journal header fields. */
    if( SQLITE_OK!=(rc = read32bits(pPager->jfd, iHdrOff+20, &iSectorSize))
     || SQLITE_OK!=(rc = read32bits(pPager->jfd, iHdrOff+24, &iPageSize))
    ){
      return rc;
    }

    /* Versions of SQLite prior to 3.5.8 set the page-size field of the
    ** journal header to zero. In this case, assume that the Pager.pageSize
    ** variable is already set to the correct page size.
    */
    if( iPageSize==0 ){
      iPageSize = pPager->pageSize;
    }

    /* Check that the values read from the page-size and sector-size fields
    ** are within range. To be 'in range', both values need to be a power
    ** of two greater than or equal to 512 or 32, and not greater than their 
    ** respective compile time maximum limits.
    */
    if( iPageSize<512                  || iSectorSize<32
     || iPageSize>SQLITE_MAX_PAGE_SIZE || iSectorSize>MAX_SECTOR_SIZE
     || ((iPageSize-1)&iPageSize)!=0   || ((iSectorSize-1)&iSectorSize)!=0 
    ){
      /* If the either the page-size or sector-size in the journal-header is 
      ** invalid, then the process that wrote the journal-header must have 
      ** crashed before the header was synced. In this case stop reading 
      ** the journal file here.
      */
      return SQLITE_DONE;
    }

    /* Update the page-size to match the value read from the journal. 
    ** Use a testcase() macro to make sure that malloc failure within 
    ** PagerSetPagesize() is tested.
    */
    rc = sqlite3PagerSetPagesize(pPager, &iPageSize, -1);
    testcase( rc!=SQLITE_OK );

    /* Update the assumed sector-size to match the value used by 
    ** the process that created this journal. If this journal was
    ** created by a process other than this one, then this routine
    ** is being called from within pager_playback(). The local value
    ** of Pager.sectorSize is restored at the end of that routine.
    */
    pPager->sectorSize = iSectorSize;
  }

  pPager->journalOff += JOURNAL_HDR_SZ(pPager);
  return rc;
}